

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::js::GeneratorOptions::ParseFromOptions
          (GeneratorOptions *this,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *options,string *error)

{
  pointer ppVar1;
  bool bVar2;
  bool bVar3;
  LogMessage *other;
  ulong uVar4;
  GeneratorOptions *pGVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  LogMessage local_68;
  
  lVar6 = 0;
  uVar4 = 0;
LAB_0029fdd3:
  ppVar1 = (options->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(options->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 6) <= uVar4) {
    bVar2 = true;
    if ((this->import_style != kImportClosure) &&
       ((((this->add_require_for_enums != false || (this->testonly != false)) ||
         ((this->library)._M_string_length != 0)) ||
        ((bVar3 = std::operator!=(&this->extension,".js"), bVar3 ||
         (this->one_output_file_per_input_file == true)))))) {
LAB_002a01e0:
      std::__cxx11::string::assign((char *)error);
LAB_002a01ea:
      bVar2 = false;
    }
    return bVar2;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&(ppVar1->first)._M_dataplus._M_p + lVar6),"add_require_for_enums")
  ;
  ppVar1 = (options->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (bVar2) {
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(ppVar1->second)._M_dataplus._M_p + lVar6),"");
    if (bVar2) goto LAB_002a01e0;
    this->add_require_for_enums = true;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(ppVar1->first)._M_dataplus._M_p + lVar6),"binary");
    ppVar1 = (options->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (bVar2) {
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(ppVar1->second)._M_dataplus._M_p + lVar6),"");
      if (bVar2) goto LAB_002a01e0;
      this->binary = true;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(ppVar1->first)._M_dataplus._M_p + lVar6),"testonly");
      ppVar1 = (options->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (bVar2) {
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(ppVar1->second)._M_dataplus._M_p + lVar6),"");
        if (bVar2) goto LAB_002a01e0;
        this->testonly = true;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(ppVar1->first)._M_dataplus._M_p + lVar6),
                                "error_on_name_conflict");
        if (bVar2) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_WARNING,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                     ,0xd8d);
          other = internal::LogMessage::operator<<
                            (&local_68,
                             "Ignoring error_on_name_conflict option, this will be removed in a future release"
                            );
          internal::LogFinisher::operator=((LogFinisher *)&local_88,other);
          internal::LogMessage::~LogMessage(&local_68);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&(((options->
                                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->first).
                                             _M_dataplus._M_p + lVar6),"output_dir");
          pGVar5 = this;
          if (!bVar2) {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&(((options->
                                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first)
                                               ._M_dataplus._M_p + lVar6),"namespace_prefix");
            pGVar5 = (GeneratorOptions *)&this->namespace_prefix;
            if (!bVar2) {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&(((options->
                                                                                                      
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                 )._M_dataplus._M_p + lVar6),"library");
              pGVar5 = (GeneratorOptions *)&this->library;
              if (!bVar2) {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&(((options->
                                                                                                          
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar6),"import_style");
                ppVar1 = (options->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if (bVar2) {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&(ppVar1->second)._M_dataplus._M_p + lVar6),
                                          "closure");
                  if (bVar2) {
                    this->import_style = kImportClosure;
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&(((options->
                                                                                                                  
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar6),"commonjs");
                    if (bVar2) {
                      this->import_style = kImportCommonJs;
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)&(((options->
                                                                                                                      
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar6),
                                              "commonjs_strict");
                      if (bVar2) {
                        this->import_style = kImportCommonJsStrict;
                      }
                      else {
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)((long)&(((options->
                                                                                                                          
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar6),"browser");
                        if (bVar2) {
                          this->import_style = kImportBrowser;
                        }
                        else {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&(((options->
                                                                                                                            
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar6),"es6");
                          if (bVar2) {
                            this->import_style = kImportEs6;
                          }
                          else {
                            std::operator+(&local_a8,"Unknown import style ",
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)((long)&(((options->
                                                                                                                
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar6));
                            std::operator+(&local_88,&local_a8,", expected ");
                            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_68,&local_88,
                                           "one of: closure, commonjs, browser, es6.");
                            std::__cxx11::string::operator=((string *)error,(string *)&local_68);
                            std::__cxx11::string::~string((string *)&local_68);
                            std::__cxx11::string::~string((string *)&local_88);
                            std::__cxx11::string::~string((string *)&local_a8);
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&(ppVar1->first)._M_dataplus._M_p + lVar6),
                                          "extension");
                  pGVar5 = (GeneratorOptions *)&this->extension;
                  if (bVar2) goto LAB_0029ff6e;
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&(((options->
                                                                                                              
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar6),
                                          "one_output_file_per_input_file");
                  ppVar1 = (options->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  if (bVar2) {
                    if (*(long *)((long)&(ppVar1->second)._M_string_length + lVar6) == 0) {
                      this->one_output_file_per_input_file = true;
                      goto LAB_0029ff73;
                    }
                    goto LAB_002a01e0;
                  }
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&(ppVar1->first)._M_dataplus._M_p + lVar6),
                                          "annotate_code");
                  ppVar1 = (options->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  if (!bVar2) {
                    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&(ppVar1->second)._M_dataplus._M_p + lVar6),""
                                           );
                    pGVar5 = this;
                    if (!bVar2) goto LAB_0029ff6e;
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_68,"Unknown option: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&(((options->
                                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->first).
                                              _M_dataplus._M_p + lVar6));
                    std::__cxx11::string::operator=((string *)error,(string *)&local_68);
                    std::__cxx11::string::~string((string *)&local_68);
                    goto LAB_002a01ea;
                  }
                  if (*(long *)((long)&(ppVar1->second)._M_string_length + lVar6) != 0)
                  goto LAB_002a01e0;
                  this->annotate_code = true;
                }
                goto LAB_0029ff73;
              }
            }
          }
LAB_0029ff6e:
          std::__cxx11::string::_M_assign((string *)pGVar5);
        }
      }
    }
  }
LAB_0029ff73:
  uVar4 = uVar4 + 1;
  lVar6 = lVar6 + 0x40;
  goto LAB_0029fdd3;
}

Assistant:

bool GeneratorOptions::ParseFromOptions(
    const std::vector<std::pair<std::string, std::string> >& options,
    std::string* error) {
  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "add_require_for_enums") {
      if (options[i].second != "") {
        *error = "Unexpected option value for add_require_for_enums";
        return false;
      }
      add_require_for_enums = true;
    } else if (options[i].first == "binary") {
      if (options[i].second != "") {
        *error = "Unexpected option value for binary";
        return false;
      }
      binary = true;
    } else if (options[i].first == "testonly") {
      if (options[i].second != "") {
        *error = "Unexpected option value for testonly";
        return false;
      }
      testonly = true;

    } else if (options[i].first == "error_on_name_conflict") {
      GOOGLE_LOG(WARNING) << "Ignoring error_on_name_conflict option, this "
                             "will be removed in a future release";
    } else if (options[i].first == "output_dir") {
      output_dir = options[i].second;
    } else if (options[i].first == "namespace_prefix") {
      namespace_prefix = options[i].second;
    } else if (options[i].first == "library") {
      library = options[i].second;
    } else if (options[i].first == "import_style") {
      if (options[i].second == "closure") {
        import_style = kImportClosure;
      } else if (options[i].second == "commonjs") {
        import_style = kImportCommonJs;
      } else if (options[i].second == "commonjs_strict") {
        import_style = kImportCommonJsStrict;
      } else if (options[i].second == "browser") {
        import_style = kImportBrowser;
      } else if (options[i].second == "es6") {
        import_style = kImportEs6;
      } else {
        *error = "Unknown import style " + options[i].second + ", expected " +
                 "one of: closure, commonjs, browser, es6.";
      }
    } else if (options[i].first == "extension") {
      extension = options[i].second;
    } else if (options[i].first == "one_output_file_per_input_file") {
      if (!options[i].second.empty()) {
        *error = "Unexpected option value for one_output_file_per_input_file";
        return false;
      }
      one_output_file_per_input_file = true;
    } else if (options[i].first == "annotate_code") {
      if (!options[i].second.empty()) {
        *error = "Unexpected option value for annotate_code";
        return false;
      }
      annotate_code = true;
    } else {
      // Assume any other option is an output directory, as long as it is a bare
      // `key` rather than a `key=value` option.
      if (options[i].second != "") {
        *error = "Unknown option: " + options[i].first;
        return false;
      }
      output_dir = options[i].first;
    }
  }

  if (import_style != kImportClosure &&
      (add_require_for_enums || testonly || !library.empty() ||
       extension != ".js" || one_output_file_per_input_file)) {
    *error =
        "The add_require_for_enums, testonly, library, extension, and "
        "one_output_file_per_input_file options should only be "
        "used for import_style=closure";
    return false;
  }

  return true;
}